

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  float *pfVar1;
  int y;
  int iVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  allocator_type local_41;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fb,(long)(height * width),&local_41);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1907
             ,0x1406,fb.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  fVar12 = (float)height * 0.1 + 1.0;
  iVar2 = (int)fVar12;
  iVar4 = (int)(((float)height - (fVar12 + fVar12)) + -1.0);
  if (iVar2 < iVar4) {
    fVar12 = (float)width * 0.1 + 1.0;
    iVar6 = (int)fVar12;
    iVar7 = (int)(((float)width - (fVar12 + fVar12)) + -1.0);
    iVar8 = iVar2 * width + iVar6;
    do {
      lVar9 = (long)iVar7 - (long)iVar6;
      iVar10 = iVar8;
      if (iVar6 < iVar7) {
        do {
          fVar13 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[0] - expected->m_data[0]
          ;
          fVar12 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar12 = fVar13;
          }
          if ((this->g_color_eps).m_data[0] < fVar12) {
LAB_0091da2e:
            if (iVar2 < iVar4) goto LAB_0091dbb3;
            goto LAB_0091da37;
          }
          fVar13 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[1] - expected->m_data[1]
          ;
          fVar12 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar12 = fVar13;
          }
          if ((this->g_color_eps).m_data[1] < fVar12) goto LAB_0091da2e;
          fVar13 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[2] - expected->m_data[2]
          ;
          fVar12 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar12 = fVar13;
          }
          if ((this->g_color_eps).m_data[2] < fVar12) goto LAB_0091da2e;
          iVar10 = iVar10 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      iVar2 = iVar2 + 1;
      iVar8 = iVar8 + width;
    } while (iVar2 != iVar4);
  }
LAB_0091da37:
  iVar2 = width * 2 + 2;
  fVar12 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[0];
  fVar13 = -fVar12;
  if (-fVar12 <= fVar12) {
    fVar13 = fVar12;
  }
  fVar12 = (this->g_color_eps).m_data[0];
  if (fVar12 < fVar13) {
LAB_0091da89:
    bVar5 = false;
  }
  else {
    fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[1];
    fVar11 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar11 = fVar13;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar11 && fVar11 != *pfVar1) goto LAB_0091da89;
    fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[2];
    fVar11 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar11 = fVar13;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar5 = fVar11 < *pfVar1 || fVar11 == *pfVar1;
  }
  iVar2 = width * 3 + -3;
  fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[0];
  fVar11 = -fVar13;
  if (-fVar13 <= fVar13) {
    fVar11 = fVar13;
  }
  if (fVar12 < fVar11) {
LAB_0091daee:
    bVar3 = 0;
  }
  else {
    fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[1];
    fVar11 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar11 = fVar13;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar11 && fVar11 != *pfVar1) goto LAB_0091daee;
    fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[2];
    fVar11 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar11 = fVar13;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar3 = (fVar11 < *pfVar1 || fVar11 == *pfVar1) & bVar5;
  }
  iVar4 = (height + -3) * width;
  iVar2 = width + -3 + iVar4;
  fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[0];
  fVar11 = -fVar13;
  if (-fVar13 <= fVar13) {
    fVar11 = fVar13;
  }
  if (fVar12 < fVar11) {
LAB_0091db54:
    bVar3 = 0;
  }
  else {
    fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[1];
    fVar11 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar11 = fVar13;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar11 && fVar11 != *pfVar1) goto LAB_0091db54;
    fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].m_data[2];
    fVar11 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar11 = fVar13;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar3 = (fVar11 < *pfVar1 || fVar11 == *pfVar1) & bVar3;
  }
  iVar4 = iVar4 + 2;
  fVar13 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0];
  fVar11 = -fVar13;
  if (-fVar13 <= fVar13) {
    fVar11 = fVar13;
  }
  if (fVar11 <= fVar12) {
    fVar12 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1];
    fVar13 = -fVar12;
    if (-fVar12 <= fVar12) {
      fVar13 = fVar12;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (fVar13 < *pfVar1 || fVar13 == *pfVar1) {
      fVar12 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2];
      fVar13 = -fVar12;
      if (-fVar12 <= fVar12) {
        fVar13 = fVar12;
      }
      pfVar1 = (this->g_color_eps).m_data + 2;
      bVar5 = (bool)((fVar13 < *pfVar1 || fVar13 == *pfVar1) & bVar3);
      goto LAB_0091dbb5;
    }
  }
LAB_0091dbb3:
  bVar5 = false;
LAB_0091dbb5:
  if (fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool			  result = true;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		int startx = int(((float)width * 0.1f) + 1);
		int starty = int(((float)height * 0.1f) + 1);
		int endx   = int((float)width - 2 * (((float)width * 0.1f) + 1) - 1);
		int endy   = int((float)height - 2 * (((float)height * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}